

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isonumber.c
# Opt level: O3

int isonumber_to_u64(uint64_t *dst,char *iso,uint64_t scaling)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int *piVar5;
  ulong uVar6;
  char *pcVar7;
  char cVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  char *local_38;
  
  local_38 = (char *)0x0;
  piVar5 = __errno_location();
  *piVar5 = 0;
  uVar6 = strtoull(iso,&local_38,10);
  iVar10 = -1;
  if (*piVar5 == 0) {
    cVar8 = *local_38;
    if (cVar8 == '\0') {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = scaling;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar6;
      if (SUB168(auVar1 * auVar3,8) != 0) {
        return -1;
      }
      uVar12 = uVar6 * scaling;
    }
    else {
      if (cVar8 == '.') {
        uVar12 = 1;
        cVar8 = local_38[1];
        pcVar7 = local_38;
        while (local_38 = pcVar7 + 1, (byte)(cVar8 - 0x30U) < 10) {
          uVar6 = (ulong)(byte)(cVar8 - 0x30) + uVar6 * 10;
          uVar12 = uVar12 * 10;
          cVar8 = pcVar7[2];
          pcVar7 = local_38;
        }
      }
      else {
        uVar12 = 1;
      }
      for (; uVar12 < scaling; uVar12 = uVar12 * 10) {
        uVar6 = uVar6 * 10;
      }
      while (cVar8 == ' ') {
        pcVar7 = local_38 + 1;
        local_38 = local_38 + 1;
        cVar8 = *pcVar7;
      }
      if (cVar8 == '\0') {
        uVar9 = 1;
      }
      else {
        if (local_38[1] != '\0') {
          return -1;
        }
        pcVar7 = (char *)memchr(" kMGTPE",(int)cVar8,8);
        if (pcVar7 == (char *)0x0) {
          return -1;
        }
        uVar9 = 1;
        for (; " kMGTPE" < pcVar7; pcVar7 = pcVar7 + -1) {
          uVar9 = uVar9 * 1000;
        }
      }
      uVar11 = 999;
      if (999 < scaling) {
        uVar11 = scaling;
      }
      for (; uVar11 < uVar12; uVar12 = uVar12 / 1000) {
        if (uVar9 < 2) {
          uVar6 = uVar6 / 1000;
        }
        else {
          uVar9 = uVar9 / 1000;
        }
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar9;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar6;
      if (SUB168(auVar2 * auVar4,8) != 0) {
        return -1;
      }
      uVar12 = (uVar6 * scaling * uVar9) / uVar12;
    }
    *dst = uVar12;
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int
isonumber_to_u64(uint64_t *dst, const char *iso, uint64_t scaling) {
  static const char symbol_large[] = " kMGTPE";

  uint64_t num, fraction_scale, factor;
  char *next = NULL, *prefix;

  errno = 0;
  num = strtoull(iso, &next, 10);
  if (errno) {
    return -1;
  }

  if (*next == 0) {
    if (num > UINT64_MAX / scaling) {
      /* this would be an integer overflow */
      return -1;
    }

    *dst = num * scaling;
    return 0;
  }

  /* Handle fractional part */
  fraction_scale = 1;
  if (*next == '.') {
    next++;
    while (*next >= '0' && *next <= '9') {
      num *= 10;
      num += (*next - '0');
      fraction_scale *= 10;
      next++;
    }
  }
  while (fraction_scale < scaling) {
    num *= 10;
    fraction_scale *= 10;
  }

  /* handle spaces */
  while (*next == ' ') {
    next++;
  }

  factor = 1;
  if (*next) {
    /* handle iso-prefix */
    if (next[1] != 0) {
      return -1;
    }

    prefix = strchr(symbol_large, next[0]);
    if (!prefix) {
      return -1;
    }

    while (prefix > symbol_large) {
      factor *= 1000;
      prefix--;
    }
  }

  while (fraction_scale > scaling && fraction_scale >= 1000) {
    fraction_scale /= 1000;
    if (factor > 1) {
      factor /= 1000;
    }
    else {
      num /= 1000;
    }
  }

  if (num > UINT64_MAX / factor) {
    /* this would be an integer overflow */
    return -1;
  }

  *dst = num * factor * scaling / fraction_scale;
  return 0;
}